

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O1

void TTD::NSLogEvents::SetExceptionAction_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  long lVar1;
  ScriptContext *scriptContext;
  Var aValue;
  RecyclableObject *value;
  Recycler *alloc;
  JavascriptExceptionObject *this;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  scriptContext = ThreadContextTTD::GetActiveScriptContext(executeContext);
  if (scriptContext == (ScriptContext *)0x0) {
    TTDAbort_unrecoverable_error("This should be non-null!!!");
  }
  if (evt->EventKind == SetExceptionActionTag) {
    aValue = InflateVarInReplay(executeContext,(TTDVar)evt[1].EventTimeStamp);
    if (aValue != (Var)0x0) {
      if ((ulong)aValue >> 0x30 == 0) {
        value = Js::VarTo<Js::RecyclableObject>(aValue);
        if ((((((value->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
            scriptContext.ptr != scriptContext) {
          aValue = Js::CrossSite::MarshalVar(scriptContext,value,false);
        }
      }
      lVar1._0_4_ = evt[2].EventKind;
      lVar1._4_4_ = evt[2].ResultStatus;
      local_50 = (undefined1  [8])&Js::JavascriptExceptionObject::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_3faffa0;
      data.filename._0_4_ = 0x1d9;
      alloc = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_50);
      this = (JavascriptExceptionObject *)new<Memory::Recycler>(0x50,alloc,0x38bbb2);
      Js::JavascriptExceptionObject::JavascriptExceptionObject
                (this,aValue,scriptContext,(JavascriptExceptionContext *)0x0,false);
      Js::ScriptContext::RecordException(scriptContext,this,lVar1 != 0);
    }
    return;
  }
  TTDAbort_unrecoverable_error("Bad tag match!");
}

Assistant:

void SetExceptionAction_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);
            const JsRTSingleVarScalarArgumentAction* action = GetInlineEventDataAs<JsRTSingleVarScalarArgumentAction, EventKind::SetExceptionActionTag>(evt);
            Js::Var exception = InflateVarInReplay(executeContext, GetVarItem_0(action));
            TTD_REPLAY_VALIDATE_INCOMING_REFERENCE(exception, ctx);

            bool propagateToDebugger = GetScalarItem_0(action) ? true : false;

            Js::JavascriptExceptionObject *exceptionObject;
            exceptionObject = RecyclerNew(ctx->GetRecycler(), Js::JavascriptExceptionObject, exception, ctx, nullptr);

            ctx->RecordException(exceptionObject, propagateToDebugger);
        }